

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS2fstreamMPI.cpp
# Opt level: O2

void __thiscall
adios2::fstream::fstream
          (fstream *this,string *name,openmode mode,MPI_Comm comm,string *configFile,
          string *ioInConfigFile)

{
  Comm local_48 [8];
  string *local_40;
  Comm local_34 [4];
  
  local_40 = ioInConfigFile;
  local_34 = (Comm  [4])adios2::fstream::ToMode((openmode)this);
  adios2::helper::CommDupMPI((ompi_communicator_t *)local_48);
  std::
  make_shared<adios2::core::Stream,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[4]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(Mode *)name,
             local_34,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             configFile,(char (*) [4])local_40);
  adios2::helper::Comm::~Comm(local_48);
  return;
}

Assistant:

fstream::fstream(const std::string &name, const openmode mode, MPI_Comm comm,
                 const std::string &configFile, const std::string ioInConfigFile)
: m_Stream(std::make_shared<core::Stream>(name, ToMode(mode), helper::CommDupMPI(comm), configFile,
                                          ioInConfigFile, "C++"))
{
}